

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void send_field_slice(int left,int width,int destination_rank)

{
  int i;
  int iVar1;
  celle ***pppcVar2;
  cellb ***pppcVar3;
  cellj ***pppcVar4;
  cellbe ***pppcVar5;
  undefined4 in_EDX;
  int in_ESI;
  int size;
  int tag;
  int iVar6;
  
  iVar6 = 0;
  i = in_ESI * 3 * ny_global * nz_global;
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x146c4b);
  pppcVar2 = field3d<celle>::operator[]((field3d<celle> *)CONCAT44(in_EDX,iVar6),i);
  iVar1 = iVar6 + 1;
  MPI_Send(**pppcVar2,i,&ompi_mpi_double,in_EDX,iVar6,&ompi_mpi_comm_world);
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x146c9a);
  pppcVar3 = field3d<cellb>::operator[]((field3d<cellb> *)CONCAT44(in_EDX,iVar1),i);
  iVar6 = iVar1 + 1;
  MPI_Send(**pppcVar3,i,&ompi_mpi_double,in_EDX,iVar1,&ompi_mpi_comm_world);
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x146ce9);
  pppcVar4 = field3d<cellj>::operator[]((field3d<cellj> *)CONCAT44(in_EDX,iVar6),i);
  iVar1 = iVar6 + 1;
  MPI_Send(**pppcVar4,i,&ompi_mpi_double,in_EDX,iVar6,&ompi_mpi_comm_world);
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x146d38);
  pppcVar5 = field3d<cellbe>::operator[]((field3d<cellbe> *)CONCAT44(in_EDX,iVar1),i);
  MPI_Send(**pppcVar5,i,&ompi_mpi_double,in_EDX,iVar1,&ompi_mpi_comm_world);
  return;
}

Assistant:

void send_field_slice(int left, int width, int destination_rank) {
    int tag = 0;

    const int size = 3 * width * ny_global * nz_global;
    MPI_Send(psr->ce[left][0], size, MPI_DOUBLE, destination_rank, tag++, MPI_COMM_WORLD);
    MPI_Send(psr->cb[left][0], size, MPI_DOUBLE, destination_rank, tag++, MPI_COMM_WORLD);
    MPI_Send(psr->cj[left][0], size, MPI_DOUBLE, destination_rank, tag++, MPI_COMM_WORLD);
    MPI_Send(psr->cbe[left][0], size, MPI_DOUBLE, destination_rank, tag++, MPI_COMM_WORLD);
}